

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

Color __thiscall Color::desaturate(Color *this,double factor)

{
  byte bVar1;
  byte bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = this->_g;
  bVar2 = this->_b;
  dVar6 = 1.0 - factor;
  dVar5 = factor * ((double)((uint)bVar1 + (uint)this->_r + (uint)bVar2) / 3.0);
  dVar3 = round((double)this->_r * dVar6 + dVar5);
  dVar4 = round((double)bVar1 * dVar6 + dVar5);
  dVar5 = round((double)bVar2 * dVar6 + dVar5);
  return (Color)((int)dVar3 & 0xffU | ((int)dVar4 & 0xffU) << 8 | ((int)dVar5 & 0xffU) << 0x10);
}

Assistant:

Color Color::desaturate(double factor) const
{
    double gray_equivalent = (_r + _g + _b) / 3.0;

    double r = (_r * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_r = (uint8_t)std::round(r);

    double g = (_g * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_g = (uint8_t)std::round(g);

    double b = (_b * (1-factor)) + (gray_equivalent * factor);
    uint8_t rounded_b = (uint8_t)std::round(b);

    return { rounded_r, rounded_g, rounded_b };
}